

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

Formula * __thiscall
Kernel::BottomUpTermTransformerFormulaTransformer::applyLiteral
          (BottomUpTermTransformerFormulaTransformer *this,Formula *f)

{
  Literal *pLVar1;
  Literal *pLVar2;
  Formula *in_RSI;
  AtomicFormula *in_RDI;
  Literal *res;
  Literal *lit;
  Literal *in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  pLVar1 = Formula::literal((Formula *)0x8590d2);
  pLVar2 = TermTransformerCommon::transformLiteral
                     ((TermTransformerCommon *)in_RDI,in_stack_ffffffffffffffb8);
  local_8 = in_RSI;
  if (pLVar1 != pLVar2) {
    local_8 = (Formula *)AtomicFormula::operator_new(0x859114);
    AtomicFormula::AtomicFormula(in_RDI,(Literal *)local_8);
  }
  return local_8;
}

Assistant:

Formula* BottomUpTermTransformerFormulaTransformer::applyLiteral(Formula* f)
{
  Literal* lit = f->literal();
  Literal* res = _termTransformer.transformLiteral(lit);
  if(lit==res) { return f; }
  return new AtomicFormula(res);
}